

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O1

bool __thiscall
glslang::TOutputTraverser::visitBinary(TOutputTraverser *this,TVisit param_1,TIntermBinary *node)

{
  TOperator TVar1;
  TInfoSink *infoSink;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  undefined4 extraout_var_00;
  TType *this_00;
  undefined4 extraout_var_01;
  TTypeList *pTVar5;
  undefined4 extraout_var_02;
  long lVar6;
  undefined4 extraout_var_03;
  TInfoSinkBase *this_01;
  char *s;
  TString local_50;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  TVar1 = (node->super_TIntermOperator).op;
  if ((int)TVar1 < 0x1df) {
    switch(TVar1) {
    case EOpAdd:
      s = "add";
      break;
    case EOpSub:
      s = "subtract";
      break;
    case EOpMul:
      s = "component-wise multiply";
      break;
    case EOpDiv:
      s = "divide";
      break;
    case EOpMod:
      s = "mod";
      break;
    case EOpRightShift:
      s = "right-shift";
      break;
    case EOpLeftShift:
      s = "left-shift";
      break;
    case EOpAnd:
      s = "bitwise and";
      break;
    case EOpInclusiveOr:
      s = "inclusive-or";
      break;
    case EOpExclusiveOr:
      s = "exclusive-or";
      break;
    case EOpEqual:
      s = "Compare Equal";
      break;
    case EOpNotEqual:
      s = "Compare Not Equal";
      break;
    case EOpVectorEqual:
      s = "Equal";
      break;
    case EOpVectorNotEqual:
      s = "NotEqual";
      break;
    case EOpLessThan:
      s = "Compare Less Than";
      break;
    case EOpGreaterThan:
      s = "Compare Greater Than";
      break;
    case EOpLessThanEqual:
      s = "Compare Less Than or Equal";
      break;
    case EOpGreaterThanEqual:
      s = "Compare Greater Than or Equal";
      break;
    case EOpVectorTimesScalar:
      s = "vector-scale";
      break;
    case EOpVectorTimesMatrix:
      s = "vector-times-matrix";
      break;
    case EOpMatrixTimesVector:
      s = "matrix-times-vector";
      break;
    case EOpMatrixTimesScalar:
      s = "matrix-scale";
      break;
    case EOpLogicalOr:
      s = "logical-or";
      break;
    case EOpLogicalXor:
      s = "logical-xor";
      break;
    case EOpLogicalAnd:
      s = "logical-and";
      break;
    case EOpIndexDirect:
      s = "direct index";
      break;
    case EOpIndexIndirect:
      s = "indirect index";
      break;
    case EOpIndexDirectStruct:
      iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf0))
                                 ((long *)CONCAT44(extraout_var,iVar2));
      iVar2 = (**(code **)(*plVar4 + 0x38))(plVar4);
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      this_00 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_00,iVar3));
      if (iVar2 == 0x12) {
        iVar2 = (*this_00->_vptr_TType[0x15])(this_00);
        this_00 = (TType *)CONCAT44(extraout_var_01,iVar2);
      }
      pTVar5 = TType::getStruct(this_00);
      iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x33])(node);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x28))
                        ((long *)CONCAT44(extraout_var_02,iVar2));
      iVar2 = (*((pTVar5->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[**(int **)(*(long *)(lVar6 + 0xc0) + 8)].
                type)->_vptr_TType[6])();
      TInfoSinkBase::append(&infoSink->debug,(TString *)CONCAT44(extraout_var_03,iVar2));
      s = ": direct index for structure";
      break;
    case EOpVectorSwizzle:
      s = "vector swizzle";
      break;
    default:
      if (TVar1 == EOpMatrixTimesMatrix) {
        s = "matrix-multiply";
        break;
      }
    case EOpComma:
switchD_00364355_caseD_2b:
      s = "<unknown op>";
    }
  }
  else {
    switch(TVar1) {
    case EOpAssign:
      s = "move second child to first child";
      break;
    case EOpAddAssign:
      s = "add second child into first child";
      break;
    case EOpSubAssign:
      s = "subtract second child into first child";
      break;
    case EOpMulAssign:
      s = "multiply second child into first child";
      break;
    case EOpVectorTimesMatrixAssign:
    case EOpMatrixTimesMatrixAssign:
      s = "matrix mult second child into first child";
      break;
    case EOpVectorTimesScalarAssign:
      s = "vector scale second child into first child";
      break;
    case EOpMatrixTimesScalarAssign:
      s = "matrix scale second child into first child";
      break;
    case EOpDivAssign:
      s = "divide second child into first child";
      break;
    case EOpModAssign:
      s = "mod second child into first child";
      break;
    case EOpAndAssign:
      s = "and second child into first child";
      break;
    case EOpInclusiveOrAssign:
      s = "or second child into first child";
      break;
    case EOpExclusiveOrAssign:
      s = "exclusive or second child into first child";
      break;
    case EOpLeftShiftAssign:
      s = "left shift second child into first child";
      break;
    case EOpRightShiftAssign:
      s = "right shift second child into first child";
      break;
    default:
      switch(TVar1) {
      case EOpAbsDifference:
        s = "absoluteDifference";
        break;
      case EOpAddSaturate:
        s = "addSaturate";
        break;
      case EOpSubSaturate:
        s = "subtractSaturate";
        break;
      case EOpAverage:
        s = "average";
        break;
      case EOpAverageRounded:
        s = "averageRounded";
        break;
      case EOpMul32x16:
        s = "multiply32x16";
        break;
      default:
        if (TVar1 == EOpMatrixSwizzle) {
          s = "matrix swizzle";
          break;
        }
        goto switchD_00364355_caseD_2b;
      }
    }
  }
  TInfoSinkBase::append(&infoSink->debug,s);
  this_01 = &infoSink->debug;
  TInfoSinkBase::append(this_01," (");
  TIntermOperator::getCompleteString_abi_cxx11_(&local_50,&node->super_TIntermOperator);
  TInfoSinkBase::append(this_01,&local_50);
  TInfoSinkBase::append(this_01,")");
  TInfoSinkBase::append(this_01,"\n");
  return true;
}

Assistant:

bool TOutputTraverser::visitBinary(TVisit /* visit */, TIntermBinary* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    switch (node->getOp()) {
    case EOpAssign:                   out.debug << "move second child to first child";           break;
    case EOpAddAssign:                out.debug << "add second child into first child";          break;
    case EOpSubAssign:                out.debug << "subtract second child into first child";     break;
    case EOpMulAssign:                out.debug << "multiply second child into first child";     break;
    case EOpVectorTimesMatrixAssign:  out.debug << "matrix mult second child into first child";  break;
    case EOpVectorTimesScalarAssign:  out.debug << "vector scale second child into first child"; break;
    case EOpMatrixTimesScalarAssign:  out.debug << "matrix scale second child into first child"; break;
    case EOpMatrixTimesMatrixAssign:  out.debug << "matrix mult second child into first child";  break;
    case EOpDivAssign:                out.debug << "divide second child into first child";       break;
    case EOpModAssign:                out.debug << "mod second child into first child";          break;
    case EOpAndAssign:                out.debug << "and second child into first child";          break;
    case EOpInclusiveOrAssign:        out.debug << "or second child into first child";           break;
    case EOpExclusiveOrAssign:        out.debug << "exclusive or second child into first child"; break;
    case EOpLeftShiftAssign:          out.debug << "left shift second child into first child";   break;
    case EOpRightShiftAssign:         out.debug << "right shift second child into first child";  break;

    case EOpIndexDirect:   out.debug << "direct index";   break;
    case EOpIndexIndirect: out.debug << "indirect index"; break;
    case EOpIndexDirectStruct:
        {
            bool reference = node->getLeft()->getType().isReference();
            const TTypeList *members = reference ? node->getLeft()->getType().getReferentType()->getStruct() : node->getLeft()->getType().getStruct();
            out.debug << (*members)[node->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst()].type->getFieldName();
            out.debug << ": direct index for structure";      break;
        }
    case EOpVectorSwizzle: out.debug << "vector swizzle"; break;
    case EOpMatrixSwizzle: out.debug << "matrix swizzle"; break;

    case EOpAdd:    out.debug << "add";                     break;
    case EOpSub:    out.debug << "subtract";                break;
    case EOpMul:    out.debug << "component-wise multiply"; break;
    case EOpDiv:    out.debug << "divide";                  break;
    case EOpMod:    out.debug << "mod";                     break;
    case EOpRightShift:  out.debug << "right-shift";  break;
    case EOpLeftShift:   out.debug << "left-shift";   break;
    case EOpAnd:         out.debug << "bitwise and";  break;
    case EOpInclusiveOr: out.debug << "inclusive-or"; break;
    case EOpExclusiveOr: out.debug << "exclusive-or"; break;
    case EOpEqual:            out.debug << "Compare Equal";                 break;
    case EOpNotEqual:         out.debug << "Compare Not Equal";             break;
    case EOpLessThan:         out.debug << "Compare Less Than";             break;
    case EOpGreaterThan:      out.debug << "Compare Greater Than";          break;
    case EOpLessThanEqual:    out.debug << "Compare Less Than or Equal";    break;
    case EOpGreaterThanEqual: out.debug << "Compare Greater Than or Equal"; break;
    case EOpVectorEqual:      out.debug << "Equal";                         break;
    case EOpVectorNotEqual:   out.debug << "NotEqual";                      break;

    case EOpVectorTimesScalar: out.debug << "vector-scale";          break;
    case EOpVectorTimesMatrix: out.debug << "vector-times-matrix";   break;
    case EOpMatrixTimesVector: out.debug << "matrix-times-vector";   break;
    case EOpMatrixTimesScalar: out.debug << "matrix-scale";          break;
    case EOpMatrixTimesMatrix: out.debug << "matrix-multiply";       break;

    case EOpLogicalOr:  out.debug << "logical-or";   break;
    case EOpLogicalXor: out.debug << "logical-xor"; break;
    case EOpLogicalAnd: out.debug << "logical-and"; break;

    case EOpAbsDifference:          out.debug << "absoluteDifference";    break;
    case EOpAddSaturate:            out.debug << "addSaturate";           break;
    case EOpSubSaturate:            out.debug << "subtractSaturate";      break;
    case EOpAverage:                out.debug << "average";               break;
    case EOpAverageRounded:         out.debug << "averageRounded";        break;
    case EOpMul32x16:               out.debug << "multiply32x16";         break;

    default: out.debug << "<unknown op>";
    }

    out.debug << " (" << node->getCompleteString() << ")";

    out.debug << "\n";

    return true;
}